

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadClass.cpp
# Opt level: O3

void __thiscall
sznet::detail::ThreadData::ThreadData
          (ThreadData *this,ThreadFunc *func,string *name,sz_pid_t *tid,CountDownLatch *latch)

{
  pointer pcVar1;
  undefined8 uVar2;
  
  (this->m_func).super__Function_base._M_manager = (_Manager_type)0x0;
  *(undefined8 *)&(this->m_func).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_func).super__Function_base._M_functor + 8) = 0;
  (this->m_func)._M_invoker = func->_M_invoker;
  if ((func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar2 = *(undefined8 *)((long)&(func->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->m_func).super__Function_base._M_functor =
         *(undefined8 *)&(func->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->m_func).super__Function_base._M_functor + 8) = uVar2;
    (this->m_func).super__Function_base._M_manager = (func->super__Function_base)._M_manager;
    (func->super__Function_base)._M_manager = (_Manager_type)0x0;
    func->_M_invoker = (_Invoker_type)0x0;
  }
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar1,pcVar1 + name->_M_string_length);
  this->m_tid = tid;
  this->m_latch = latch;
  return;
}

Assistant:

ThreadData(ThreadFunc func, const string& name, sz_pid_t* tid, CountDownLatch* latch):
		m_func(std::move(func)),
		m_name(name),
		m_tid(tid),
		m_latch(latch)
	{ 
	}